

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O3

int __thiscall
ncnn::Layer::forward
          (Layer *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  undefined8 *puVar2;
  int *piVar3;
  long lVar4;
  long *plVar5;
  int iVar6;
  pointer pMVar7;
  long lVar8;
  void *in_R8;
  long lVar9;
  Mat local_68;
  
  iVar6 = -1;
  if (this->support_inplace == true) {
    pMVar7 = (pointer)opt;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=(top_blobs,bottom_blobs);
    if (0 < (int)((ulong)((long)(top_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249) {
      lVar9 = 0;
      lVar8 = 0;
      do {
        Mat::clone(&local_68,
                   (__fn *)((long)&((bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_start)->data + lVar9),
                   opt->blob_allocator,(int)pMVar7,in_R8);
        pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar1 = (Mat *)((long)&pMVar7->data + lVar9);
        if (pMVar1 != &local_68) {
          if (local_68.refcount != (int *)0x0) {
            LOCK();
            *local_68.refcount = *local_68.refcount + 1;
            UNLOCK();
          }
          piVar3 = *(int **)((long)&pMVar7->refcount + lVar9);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              lVar4 = *(long *)((long)&pMVar7->data + lVar9);
              plVar5 = *(long **)((long)&pMVar7->allocator + lVar9);
              if (plVar5 == (long *)0x0) {
                if (lVar4 != 0) {
                  free(*(void **)(lVar4 + -8));
                }
              }
              else {
                (**(code **)(*plVar5 + 8))();
              }
            }
          }
          pMVar1->data = (void *)0x0;
          pMVar1->refcount = (int *)0x0;
          pMVar1->elemsize = 0;
          *(undefined8 *)((long)&pMVar7->cstep + lVar9) = 0;
          puVar2 = (undefined8 *)((long)&pMVar7->dims + lVar9);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(void **)((long)&pMVar7->data + lVar9) = local_68.data;
          *(int **)((long)&pMVar7->refcount + lVar9) = local_68.refcount;
          *(size_t *)((long)&pMVar7->elemsize + lVar9) = local_68.elemsize;
          *(Allocator **)((long)&pMVar7->allocator + lVar9) = local_68.allocator;
          piVar3 = (int *)((long)&pMVar7->dims + lVar9);
          *piVar3 = local_68.dims;
          piVar3[1] = local_68.w;
          piVar3[2] = local_68.h;
          piVar3[3] = local_68.c;
          *(size_t *)((long)&pMVar7->cstep + lVar9) = local_68.cstep;
        }
        if (local_68.refcount != (int *)0x0) {
          LOCK();
          *local_68.refcount = *local_68.refcount + -1;
          UNLOCK();
          if (*local_68.refcount == 0) {
            if (local_68.allocator == (Allocator *)0x0) {
              if (local_68.data != (void *)0x0) {
                free(*(void **)((long)local_68.data + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_68.allocator + 8))();
            }
          }
        }
        pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (*(long *)((long)&pMVar7->data + lVar9) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar7->c + lVar9) * *(long *)((long)&pMVar7->cstep + lVar9) == 0)
        {
          return -100;
        }
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 0x38;
      } while (lVar8 < (int)((ulong)((long)(top_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pMVar7) >> 3) * -0x49249249);
    }
    iVar6 = (*this->_vptr_Layer[6])(this,top_blobs,opt);
  }
  return iVar6;
}

Assistant:

int Layer::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    if (!support_inplace)
        return -1;

    top_blobs = bottom_blobs;
    for (int i = 0; i < (int)top_blobs.size(); i++)
    {
        top_blobs[i] = bottom_blobs[i].clone(opt.blob_allocator);
        if (top_blobs[i].empty())
            return -100;
    }

    return forward_inplace(top_blobs, opt);
}